

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

local_time_type * __thiscall
toml::basic_value<toml::type_config>::as_local_time(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == local_time) {
    return (local_time_type *)&this->field_1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_local_time()","");
  throw_bad_cast(this,&local_38,local_time);
}

Assistant:

local_time_type const& as_local_time() const
    {
        if(this->type_ != value_t::local_time)
        {
            this->throw_bad_cast("toml::value::as_local_time()", value_t::local_time);
        }
        return this->local_time_.value;
    }